

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int source_set_dynamic(SOURCE_HANDLE source,_Bool dynamic_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  SOURCE_INSTANCE *source_instance;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar2 = 0x3200;
  }
  else {
    item_value = amqpvalue_create_boolean(dynamic_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x3208;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,4,item_value);
      iVar2 = 0x320e;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int source_set_dynamic(SOURCE_HANDLE source, bool dynamic_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE dynamic_amqp_value = amqpvalue_create_boolean(dynamic_value);
        if (dynamic_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 4, dynamic_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(dynamic_amqp_value);
        }
    }

    return result;
}